

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_enc.cc
# Opt level: O0

bool __thiscall
bssl::tls13_psk_binder
          (bssl *this,uint8_t *out,size_t *out_len,SSL_SESSION *session,SSLTranscript *transcript,
          Span<const_unsigned_char> client_hello,size_t binders_len,bool is_dtls)

{
  uint16_t version;
  long lVar1;
  string_view label;
  Span<const_unsigned_char> context_00;
  Span<unsigned_char> out_00;
  bool bVar2;
  int iVar3;
  EVP_MD *md;
  undefined4 extraout_var;
  uchar *puVar4;
  size_t sVar5;
  env_md_ctx_st *peVar6;
  EVP_MD_CTX *pEVar7;
  undefined4 extraout_var_00;
  Span<const_unsigned_char> SVar8;
  byte local_281;
  Span<unsigned_char> local_280;
  uchar *local_270;
  size_t sStack_268;
  Span<const_unsigned_char> local_260;
  undefined1 local_250 [8];
  Span<const_unsigned_char> body;
  Span<const_unsigned_char> header;
  undefined1 local_220 [8];
  ScopedEVP_MD_CTX ctx;
  uchar local_1f8 [4];
  uint context_len;
  uint8_t context [64];
  Span<const_unsigned_char> truncated;
  uchar *local_198;
  size_t local_190;
  basic_string_view<char,_std::char_traits<char>_> local_188;
  Span<unsigned_char> local_178;
  Span<const_unsigned_char> local_168;
  uchar *local_158;
  uchar *local_150;
  undefined1 local_148 [8];
  Span<unsigned_char> binder_key;
  uint8_t binder_key_buf [64];
  size_t local_f0;
  size_t early_secret_len;
  uint8_t early_secret [64];
  uint local_9c;
  uchar local_98 [4];
  uint binder_context_len;
  uint8_t binder_context [64];
  EVP_MD *digest;
  bool is_dtls_local;
  SSLTranscript *transcript_local;
  SSL_SESSION *session_local;
  size_t *out_len_local;
  uint8_t *out_local;
  Span<const_unsigned_char> client_hello_local;
  
  out_local = (uint8_t *)transcript;
  client_hello_local.data_ = (uchar *)binders_len;
  md = (EVP_MD *)ssl_session_get_digest((SSL_SESSION *)out_len);
  memset(&early_secret_len,0,0x40);
  memset(&binder_key.size_,0,0x40);
  iVar3 = EVP_MD_size(md);
  Span<unsigned_char>::Span
            ((Span<unsigned_char> *)local_148,(uchar *)&binder_key.size_,
             CONCAT44(extraout_var,iVar3));
  iVar3 = EVP_Digest((void *)0x0,0,local_98,&local_9c,md,(ENGINE *)0x0);
  local_281 = 1;
  if (iVar3 != 0) {
    puVar4 = InplaceVector<unsigned_char,_64UL>::data
                       ((InplaceVector<unsigned_char,_64UL> *)((long)out_len + 10));
    sVar5 = InplaceVector<unsigned_char,_64UL>::size
                      ((InplaceVector<unsigned_char,_64UL> *)((long)out_len + 10));
    iVar3 = HKDF_extract((uint8_t *)&early_secret_len,&local_f0,(EVP_MD *)md,puVar4,sVar5,
                         (uint8_t *)0x0,0);
    local_281 = 1;
    if (iVar3 != 0) {
      local_158 = (uchar *)local_148;
      local_150 = binder_key.data_;
      Span<unsigned_char>::Span(&local_178,(uchar *)&early_secret_len,local_f0);
      Span<unsigned_char_const>::Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                ((Span<unsigned_char_const> *)&local_168,&local_178);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_188,"res binder");
      Span<unsigned_char>::Span((Span<unsigned_char> *)&truncated.size_,local_98,(ulong)local_9c);
      Span<unsigned_char_const>::Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                ((Span<unsigned_char_const> *)&local_198,(Span<unsigned_char> *)&truncated.size_);
      out_00.size_ = (size_t)local_150;
      out_00.data_ = local_158;
      label._M_str = local_188._M_str;
      label._M_len = local_188._M_len;
      SVar8.size_ = local_190;
      SVar8.data_ = local_198;
      bVar2 = hkdf_expand_label(out_00,(EVP_MD *)md,local_168,label,SVar8,
                                (bool)((byte)client_hello.size_ & 1));
      local_281 = bVar2 ^ 0xff;
    }
  }
  if ((local_281 & 1) != 0) {
    client_hello_local.size_._7_1_ = 0;
    goto LAB_001d09cc;
  }
  puVar4 = (uchar *)Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&out_local);
  if (puVar4 < client_hello.data_) {
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_enc.cc"
                  ,0x21b);
    client_hello_local.size_._7_1_ = 0;
    goto LAB_001d09cc;
  }
  sVar5 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&out_local);
  join_0x00000010_0x00000000_ =
       Span<const_unsigned_char>::subspan
                 ((Span<const_unsigned_char> *)&out_local,0,sVar5 - (long)client_hello.data_);
  internal::
  StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
  ::StackAllocatedMovable
            ((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
              *)local_220);
  if (((undefined1  [16])client_hello & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    peVar6 = internal::
             StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
             ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                    *)local_220);
    bVar2 = SSLTranscript::CopyToHashContext((SSLTranscript *)session,peVar6,(EVP_MD *)md);
    if (bVar2) {
      pEVar7 = (EVP_MD_CTX *)
               internal::
               StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
               ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                      *)local_220);
      puVar4 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)(context + 0x38));
      sVar5 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)(context + 0x38));
      iVar3 = EVP_DigestUpdate(pEVar7,puVar4,sVar5);
      if (iVar3 != 0) {
        pEVar7 = (EVP_MD_CTX *)
                 internal::
                 StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                 ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                        *)local_220);
        iVar3 = EVP_DigestFinal_ex(pEVar7,local_1f8,(uint *)((long)&ctx.ctx_.pctx_ops + 4));
        if (iVar3 != 0) {
LAB_001d0875:
          version = *(uint16_t *)((long)out_len + 4);
          Span<unsigned_char_const>::Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                    ((Span<unsigned_char_const> *)&local_260,(Span<unsigned_char> *)local_148);
          Span<unsigned_char>::Span(&local_280,local_1f8,(ulong)ctx.ctx_.pctx_ops._4_4_);
          Span<unsigned_char_const>::Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                    ((Span<unsigned_char_const> *)&local_270,&local_280);
          context_00.size_ = sStack_268;
          context_00.data_ = local_270;
          bVar2 = tls13_verify_data((uint8_t *)this,(size_t *)out,(EVP_MD *)md,version,local_260,
                                    context_00,(bool)((byte)client_hello.size_ & 1));
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            lVar1 = *(long *)out;
            iVar3 = EVP_MD_size(md);
            if (lVar1 != CONCAT44(extraout_var_00,iVar3)) {
              __assert_fail("*out_len == EVP_MD_size(digest)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_enc.cc"
                            ,0x240,
                            "bool bssl::tls13_psk_binder(uint8_t *, size_t *, const SSL_SESSION *, const SSLTranscript &, Span<const uint8_t>, size_t, bool)"
                           );
            }
            client_hello_local.size_._7_1_ = 1;
          }
          else {
            client_hello_local.size_._7_1_ = 0;
          }
          goto LAB_001d09c0;
        }
      }
    }
    client_hello_local.size_._7_1_ = 0;
  }
  else {
    sVar5 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)(context + 0x38));
    if (sVar5 < 0xc) {
      client_hello_local.size_._7_1_ = 0;
    }
    else {
      SVar8 = Span<const_unsigned_char>::subspan((Span<const_unsigned_char> *)(context + 0x38),0,4);
      body.size_ = (size_t)SVar8.data_;
      SVar8 = Span<const_unsigned_char>::subspan
                        ((Span<const_unsigned_char> *)(context + 0x38),0xc,0xffffffffffffffff);
      body.data_ = (uchar *)SVar8.size_;
      local_250 = (undefined1  [8])SVar8.data_;
      peVar6 = internal::
               StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
               ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                      *)local_220);
      bVar2 = SSLTranscript::CopyToHashContext((SSLTranscript *)session,peVar6,(EVP_MD *)md);
      if (bVar2) {
        pEVar7 = (EVP_MD_CTX *)
                 internal::
                 StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                 ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                        *)local_220);
        puVar4 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&body.size_);
        sVar5 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&body.size_);
        iVar3 = EVP_DigestUpdate(pEVar7,puVar4,sVar5);
        if (iVar3 != 0) {
          pEVar7 = (EVP_MD_CTX *)
                   internal::
                   StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                   ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                          *)local_220);
          puVar4 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)local_250);
          sVar5 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)local_250);
          iVar3 = EVP_DigestUpdate(pEVar7,puVar4,sVar5);
          if (iVar3 != 0) {
            pEVar7 = (EVP_MD_CTX *)
                     internal::
                     StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                     ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                            *)local_220);
            iVar3 = EVP_DigestFinal_ex(pEVar7,local_1f8,(uint *)((long)&ctx.ctx_.pctx_ops + 4));
            if (iVar3 != 0) goto LAB_001d0875;
          }
        }
      }
      client_hello_local.size_._7_1_ = 0;
    }
  }
LAB_001d09c0:
  internal::
  StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
  ::~StackAllocatedMovable
            ((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
              *)local_220);
LAB_001d09cc:
  return (bool)(client_hello_local.size_._7_1_ & 1);
}

Assistant:

static bool tls13_psk_binder(uint8_t *out, size_t *out_len,
                             const SSL_SESSION *session,
                             const SSLTranscript &transcript,
                             Span<const uint8_t> client_hello,
                             size_t binders_len, bool is_dtls) {
  const EVP_MD *digest = ssl_session_get_digest(session);

  // Compute the binder key.
  //
  // TODO(davidben): Ideally we wouldn't recompute early secret and the binder
  // key each time.
  uint8_t binder_context[EVP_MAX_MD_SIZE];
  unsigned binder_context_len;
  uint8_t early_secret[EVP_MAX_MD_SIZE] = {0};
  size_t early_secret_len;
  uint8_t binder_key_buf[EVP_MAX_MD_SIZE] = {0};
  auto binder_key = Span(binder_key_buf, EVP_MD_size(digest));
  if (!EVP_Digest(nullptr, 0, binder_context, &binder_context_len, digest,
                  nullptr) ||
      !HKDF_extract(early_secret, &early_secret_len, digest,
                    session->secret.data(), session->secret.size(), nullptr,
                    0) ||
      !hkdf_expand_label(binder_key, digest,
                         Span(early_secret, early_secret_len),
                         kTLS13LabelPSKBinder,
                         Span(binder_context, binder_context_len), is_dtls)) {
    return false;
  }

  // Hash the transcript and truncated ClientHello.
  if (client_hello.size() < binders_len) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }
  auto truncated = client_hello.subspan(0, client_hello.size() - binders_len);
  uint8_t context[EVP_MAX_MD_SIZE];
  unsigned context_len;
  ScopedEVP_MD_CTX ctx;
  if (!is_dtls) {
    if (!transcript.CopyToHashContext(ctx.get(), digest) ||
        !EVP_DigestUpdate(ctx.get(), truncated.data(), truncated.size()) ||
        !EVP_DigestFinal_ex(ctx.get(), context, &context_len)) {
      return false;
    }
  } else {
    // In DTLS 1.3, the transcript hash is computed over only the TLS 1.3
    // handshake messages (i.e. only type and length in the header), not the
    // full DTLSHandshake messages that are in |truncated|. This code pulls
    // the header and body out of the truncated ClientHello and writes those
    // to the hash context so the correct binder value is computed.
    if (truncated.size() < DTLS1_HM_HEADER_LENGTH) {
      return false;
    }
    auto header = truncated.subspan(0, 4);
    auto body = truncated.subspan(12);
    if (!transcript.CopyToHashContext(ctx.get(), digest) ||
        !EVP_DigestUpdate(ctx.get(), header.data(), header.size()) ||
        !EVP_DigestUpdate(ctx.get(), body.data(), body.size()) ||
        !EVP_DigestFinal_ex(ctx.get(), context, &context_len)) {
      return false;
    }
  }

  if (!tls13_verify_data(out, out_len, digest, session->ssl_version, binder_key,
                         Span(context, context_len), is_dtls)) {
    return false;
  }

  assert(*out_len == EVP_MD_size(digest));
  return true;
}